

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O0

string * muduo::ProcessInfo::threadStat_abi_cxx11_(void)

{
  uint uVar1;
  string *in_RDI;
  char buf [64];
  string *result;
  int64_t *in_stack_0000ff98;
  int64_t *in_stack_0000ffa0;
  int64_t *in_stack_0000ffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_0000ffb0;
  int in_stack_0000ffbc;
  StringArg in_stack_0000ffc0;
  StringArg local_58;
  undefined1 local_49;
  char local_48 [72];
  
  uVar1 = CurrentThread::tid();
  snprintf(local_48,0x40,"/proc/self/task/%d/stat",(ulong)uVar1);
  local_49 = 0;
  std::__cxx11::string::string(in_RDI);
  StringArg::StringArg(&local_58,local_48);
  FileUtil::readFile<std::__cxx11::string>
            (in_stack_0000ffc0,in_stack_0000ffbc,in_stack_0000ffb0,in_stack_0000ffa8,
             in_stack_0000ffa0,in_stack_0000ff98);
  return in_RDI;
}

Assistant:

string ProcessInfo::threadStat()
{
  char buf[64];
  snprintf(buf, sizeof buf, "/proc/self/task/%d/stat", CurrentThread::tid());
  string result;
  FileUtil::readFile(buf, 65536, &result);
  return result;
}